

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

void __thiscall
Assimp::LWOImporter::InternReadFile
          (LWOImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  uint *puVar1;
  undefined8 *puVar2;
  vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_> *this_00;
  pointer pSVar3;
  undefined8 uVar4;
  long lVar5;
  aiVector3D *paVar6;
  undefined8 uVar7;
  Layer *layer;
  LWOImporter *pLVar8;
  aiScene *paVar9;
  pointer __src;
  _List_node_base **this_01;
  pointer pvVar10;
  bool bVar11;
  uint mui;
  int iVar12;
  uint uVar13;
  undefined4 extraout_var;
  char *pcVar15;
  Logger *pLVar16;
  ulong uVar17;
  size_type __n;
  aiMesh *paVar18;
  aiVector3D *__s;
  ulong *puVar19;
  long lVar20;
  aiVector3D *paVar21;
  aiColor4D *paVar22;
  _List_node_base *p_Var23;
  aiNode *this_02;
  uint *puVar24;
  ulong uVar25;
  mapped_type *ppaVar26;
  aiMaterial **ppaVar27;
  aiMaterial *this_03;
  aiMesh **__dest;
  DeadlyImportError *pDVar28;
  long lVar29;
  _List_node_base *p_Var30;
  uint w_1;
  long lVar31;
  uint w;
  aiMesh *paVar32;
  uint mat;
  _List_node_base *p_Var33;
  _List_node_base *p_Var34;
  SortedRep *sorted;
  aiMesh *mesh;
  LWOImporter *local_370;
  aiMesh *local_368;
  uint local_35c;
  uint local_358;
  uint i;
  _List_node_base *local_350;
  aiMesh *local_348;
  uint32_t fileType;
  aiScene *local_338;
  aiColor4D *local_330;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> apcMeshes;
  value_type_conflict2 local_2fc;
  _List_node_base **local_2f8;
  uint *local_2f0;
  SurfaceList _mSurfaces;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  pSorted;
  map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  apcNodes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mBuffer;
  aiColor4D *pvVC [8];
  TagMappingTable _mMapping;
  LayerList _mLayers;
  uint vUVChannelIndices [8];
  uint vVColorIndices [8];
  TagList _mTags;
  aiVector3D *pvUV [8];
  long *plVar14;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)pvUV,"rb",(allocator<char> *)pvVC);
  iVar12 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,pvUV[0]);
  plVar14 = (long *)CONCAT44(extraout_var,iVar12);
  std::__cxx11::string::~string((string *)pvUV);
  if (plVar14 == (long *)0x0) {
    pDVar28 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvVC,
                   "Failed to open LWO file ",pFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvUV,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvVC,".");
    DeadlyImportError::DeadlyImportError(pDVar28,(string *)pvUV);
    __cxa_throw(pDVar28,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar13 = (**(code **)(*plVar14 + 0x30))(plVar14);
  this->fileSize = uVar13;
  if (uVar13 < 0xc) {
    pDVar28 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)pvUV,"LWO: The file is too small to contain the IFF header",
               (allocator<char> *)pvVC);
    DeadlyImportError::DeadlyImportError(pDVar28,(string *)pvUV);
    __cxa_throw(pDVar28,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&mBuffer,(ulong)uVar13,(allocator_type *)pvUV);
  (**(code **)(*plVar14 + 0x10))
            (plVar14,mBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,1,this->fileSize);
  this->pScene = pScene;
  pcVar15 = IFF::ReadHeader(mBuffer.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,&fileType);
  if (pcVar15 != (char *)0x0) {
    pDVar28 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)pvUV,pcVar15,(allocator<char> *)pvVC);
    DeadlyImportError::DeadlyImportError(pDVar28,(string *)pvUV);
    __cxa_throw(pDVar28,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  this->mFileBuffer =
       mBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 0xc;
  this->fileSize = this->fileSize - 0xc;
  this->hasNamedLayer = false;
  _mLayers.super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&_mLayers;
  _mLayers.super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>._M_impl._M_node
  ._M_size = 0;
  _mSurfaces.super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _mSurfaces.super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  _mSurfaces.super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  _mTags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _mTags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _mTags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _mMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  _mMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _mMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mLayers =
       (LayerList *)
       _mLayers.super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  this->mTags = &_mTags;
  this->mMapping = &_mMapping;
  this->mSurfaces = &_mSurfaces;
  _mLayers.super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>._M_impl._M_node
  .super__List_node_base._M_prev =
       _mLayers.super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  LWO::Layer::Layer((Layer *)pvUV);
  std::__cxx11::list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::push_back
            (&_mLayers,(value_type *)pvUV);
  LWO::Layer::~Layer((Layer *)pvUV);
  p_Var30 = (this->mLayers->
            super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>)._M_impl.
            _M_node.super__List_node_base._M_prev;
  this->mCurLayer = (Layer *)(p_Var30 + 1);
  std::__cxx11::string::assign((char *)&p_Var30[0x13]._M_prev);
  this->mCurLayer->mIndex = 0xffff;
  if (fileType == 0x4c574f32) {
    this->mIsLXOB = false;
    pLVar16 = DefaultLogger::get();
    pcVar15 = "LWO file format: LWO2 (>= LightWave 6)";
  }
  else {
    if (fileType != 0x4c584f42) {
      if (fileType != 0x4c574f42) {
        apcNodes._M_t._M_impl._0_1_ = SUB41(fileType >> 0x18,0);
        apcNodes._M_t._M_impl._1_1_ = SUB41(fileType >> 0x10,0);
        apcNodes._M_t._M_impl._2_1_ = SUB41(fileType >> 8,0);
        apcNodes._M_t._M_impl._3_1_ = SUB41(fileType,0);
        apcNodes._M_t._M_impl._4_1_ = 0;
        pDVar28 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)pvVC,"Unknown LWO sub format: ",(allocator<char> *)vUVChannelIndices);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvUV,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvVC,
                       (char *)&apcNodes);
        DeadlyImportError::DeadlyImportError(pDVar28,(string *)pvUV);
        __cxa_throw(pDVar28,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      pLVar16 = DefaultLogger::get();
      Logger::info(pLVar16,"LWO file format: LWOB (<= LightWave 5.5)");
      this->mIsLWO2 = false;
      this->mIsLXOB = false;
      LoadLWOBFile(this);
      goto LAB_003ae7c7;
    }
    this->mIsLXOB = true;
    pLVar16 = DefaultLogger::get();
    pcVar15 = "LWO file format: LXOB (Modo)";
  }
  Logger::info(pLVar16,pcVar15);
LAB_003ae7c7:
  if (fileType != 0x4c574f42) {
    this->mIsLWO2 = true;
    LoadLWO2File(this);
    if (this->configLayerIndex != 0xffffffff) {
      iVar12 = 0;
      p_Var30 = (_List_node_base *)this->mLayers;
      while (p_Var30 = (((_List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> *)
                        &p_Var30->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var30 != (_List_node_base *)this->mLayers) {
        iVar12 = iVar12 + ((byte)*(undefined1 *)((long)&p_Var30[0x16]._M_next + 4) ^ 1);
      }
      if (iVar12 != 2) {
        pDVar28 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)pvUV,"LWO2: The requested layer was not found",(allocator<char> *)pvVC)
        ;
        DeadlyImportError::DeadlyImportError(pDVar28,(string *)pvUV);
        __cxa_throw(pDVar28,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    if (((this->configLayerName)._M_string_length != 0) && (this->hasNamedLayer == false)) {
      pDVar28 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvUV,
                     "LWO2: Unable to find the requested layer: ",&this->configLayerName);
      DeadlyImportError::DeadlyImportError(pDVar28,(string *)pvUV);
      __cxa_throw(pDVar28,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  ResolveTags(this);
  ResolveClips(this);
  apcMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  apcNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &apcNodes._M_t._M_impl.super__Rb_tree_header._M_header;
  apcNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  apcNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  apcNodes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  apcMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  apcMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar17 = ((long)(this->mSurfaces->
                  super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->mSurfaces->
                 super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>).
                 _M_impl.super__Vector_impl_data._M_start) / 0x148;
  __n = (size_type)((uint)uVar17 & 0xfffffffe);
  if ((uVar17 & 0xfffffffe) != 0) {
    __n = (this->mLayers->super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>)
          ._M_impl._M_node._M_size;
  }
  local_338 = pScene;
  apcNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       apcNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(&apcMeshes,__n);
  p_Var30 = (_List_node_base *)this->mLayers;
  local_35c = 0xffffffff;
  p_Var33 = p_Var30;
  local_370 = this;
  do {
    do {
      paVar9 = local_338;
      pLVar8 = local_370;
      p_Var33 = (((_List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> *)
                 &p_Var33->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var33 == p_Var30) {
        if ((apcNodes._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
           (apcMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            apcMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish)) {
          uVar17 = ((long)(local_370->mSurfaces->
                          super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_370->mSurfaces->
                         super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x148;
          local_338->mNumMaterials = (uint)uVar17;
          ppaVar27 = (aiMaterial **)operator_new__((uVar17 & 0xffffffff) << 3);
          paVar9->mMaterials = ppaVar27;
          lVar20 = 0;
          for (uVar25 = 0;
              __src = apcMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                      super__Vector_impl_data._M_start, paVar9 = local_338,
              uVar25 < (uVar17 & 0xffffffff); uVar25 = uVar25 + 1) {
            this_03 = (aiMaterial *)operator_new(0x10);
            aiMaterial::aiMaterial(this_03);
            local_338->mMaterials[uVar25] = this_03;
            ConvertMaterial(pLVar8,(Surface *)
                                   ((long)&(((pLVar8->mSurfaces->
                                             super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->mName).
                                           _M_dataplus._M_p + lVar20),this_03);
            uVar17 = (ulong)local_338->mNumMaterials;
            lVar20 = lVar20 + 0x148;
          }
          local_338->mNumMeshes =
               (uint)((ulong)((long)apcMeshes.
                                    super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)apcMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
          uVar17 = (long)apcMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)apcMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                         super__Vector_impl_data._M_start & 0x7fffffff8;
          __dest = (aiMesh **)operator_new__(uVar17);
          paVar9->mMeshes = __dest;
          memcpy(__dest,__src,uVar17);
          GenerateNodeGraph(pLVar8,&apcNodes);
          std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_aiNode_*>,_std::_Select1st<std::pair<const_unsigned_short,_aiNode_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
          ::~_Rb_tree(&apcNodes._M_t);
          std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
                    (&apcMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&_mMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&_mTags);
          std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::~vector
                    (&_mSurfaces);
          std::__cxx11::_List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::
          _M_clear(&_mLayers.
                    super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&mBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          (**(code **)(*plVar14 + 8))();
          return;
        }
        pDVar28 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)pvUV,"LWO: No meshes loaded",(allocator<char> *)pvVC);
        DeadlyImportError::DeadlyImportError(pDVar28,(string *)pvUV);
        __cxa_throw(pDVar28,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
    } while (*(undefined1 *)((long)&p_Var33[0x16]._M_next + 4) != '\0');
    layer = (Layer *)(p_Var33 + 1);
    lVar29 = (long)apcMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)apcMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    lVar20 = lVar29;
    if ((p_Var33[0x11]._M_next != p_Var33[0x11]._M_prev) &&
       (p_Var33[1]._M_next != p_Var33[1]._M_prev)) {
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector(&pSorted,((long)(local_370->mSurfaces->
                               super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_370->mSurfaces->
                              super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                              )._M_impl.super__Vector_impl_data._M_start) / 0x148 + 1,
               (allocator_type *)pvUV);
      i = 0;
      p_Var34 = p_Var33[0x11]._M_prev;
      local_350 = p_Var34;
      for (p_Var23 = p_Var33[0x11]._M_next; p_Var23 != p_Var34; p_Var23 = p_Var23 + 2) {
        iVar12 = *(int *)&p_Var23[1]._M_prev;
        if ((((iVar12 == 0x424f4e45) || (iVar12 == 0x46414345)) || (iVar12 == 0x53554244)) ||
           (iVar12 == 0x50544348)) {
          uVar13 = *(uint *)&p_Var23[1]._M_next;
          if ((ulong)uVar13 <
              (ulong)((long)(local_370->mTags->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_370->mTags->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            if ((uVar13 == 0xffffffff) ||
               (uVar17 = (ulong)_mMapping.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar13],
               _mMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13] == 0xffffffff)) goto LAB_003ae9f8;
          }
          else {
            pLVar16 = DefaultLogger::get();
            Logger::warn(pLVar16,"LWO: Invalid face surface index");
LAB_003ae9f8:
            uVar17 = (ulong)local_35c;
            if (local_35c == 0xffffffff) {
              this_00 = local_370->mSurfaces;
              uVar17 = ((long)(this_00->
                              super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_00->
                             super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                             )._M_impl.super__Vector_impl_data._M_start) / 0x148;
              LWO::Surface::Surface((Surface *)pvUV);
              std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::
              emplace_back<Assimp::LWO::Surface>(this_00,(Surface *)pvUV);
              LWO::Surface::~Surface((Surface *)pvUV);
              pSVar3 = (local_370->mSurfaces->
                       super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              pSVar3[-1].mColor.b = 0.6;
              pSVar3[-1].mColor.r = 0.6;
              pSVar3[-1].mColor.g = 0.6;
              std::__cxx11::string::assign((char *)(pSVar3 + -1));
              local_35c = (uint)uVar17;
              p_Var34 = local_350;
            }
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (pSorted.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (uVar17 & 0xffffffff),&i);
        }
        i = i + 1;
      }
      if (local_35c == 0xffffffff) {
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::erase(&pSorted,pSorted.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1);
      }
      local_2f8 = &p_Var33[2]._M_prev;
      paVar32 = (aiMesh *)0x0;
      while (pvVar10 = pSorted.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
            paVar32 < (aiMesh *)
                      (((long)(local_370->mSurfaces->
                              super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_370->mSurfaces->
                             super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                             )._M_impl.super__Vector_impl_data._M_start) / 0x148)) {
        uVar13 = (uint)paVar32;
        local_368 = paVar32;
        if (pSorted.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)paVar32].
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            pSorted.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)paVar32].
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          paVar18 = (aiMesh *)operator_new(0x520);
          aiMesh::aiMesh(paVar18);
          mesh = paVar18;
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(&apcMeshes,&mesh);
          paVar18 = mesh;
          sorted = pvVar10 + (long)paVar32;
          mesh->mNumFaces =
               (uint)((ulong)((long)(sorted->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(sorted->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
          local_2f0 = (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          for (puVar24 = (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start; puVar24 != local_2f0;
              puVar24 = puVar24 + 1) {
            mesh->mNumVertices =
                 mesh->mNumVertices + *(int *)((long)p_Var33[0x11]._M_next + (ulong)*puVar24 * 0x20)
            ;
          }
          uVar13 = mesh->mNumVertices;
          uVar17 = (ulong)uVar13 * 0xc;
          local_358 = (uint)paVar32;
          __s = (aiVector3D *)operator_new__(uVar17);
          if (uVar13 != 0) {
            uVar17 = uVar17 - 0xc;
            memset(__s,0,(uVar17 - uVar17 % 0xc) + 0xc);
          }
          paVar18->mVertices = __s;
          uVar17 = (ulong)paVar18->mNumFaces;
          puVar19 = (ulong *)operator_new__(uVar17 * 0x10 + 8);
          paVar32 = local_368;
          pLVar8 = local_370;
          *puVar19 = uVar17;
          local_350 = (_List_node_base *)(puVar19 + 1);
          if (uVar17 != 0) {
            p_Var23 = local_350;
            do {
              *(undefined4 *)&p_Var23->_M_next = 0;
              p_Var23->_M_prev = (_List_node_base *)0x0;
              p_Var23 = p_Var23 + 1;
            } while (p_Var23 != local_350 + uVar17);
          }
          paVar18->mFaces = (aiFace *)local_350;
          paVar18->mMaterialIndex = local_358;
          for (lVar20 = 0; lVar20 != 8; lVar20 = lVar20 + 1) {
            vUVChannelIndices[lVar20] = 0xffffffff;
          }
          for (lVar20 = 0; lVar20 != 8; lVar20 = lVar20 + 1) {
            vVColorIndices[lVar20] = 0xffffffff;
          }
          FindUVChannels(local_370,
                         _mSurfaces.
                         super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                         ._M_impl.super__Vector_impl_data._M_start + (long)local_368,sorted,layer,
                         vUVChannelIndices);
          FindVCChannels(pLVar8,_mSurfaces.
                                super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                                ._M_impl.super__Vector_impl_data._M_start + (long)paVar32,sorted,
                         layer,vVColorIndices);
          paVar18 = (aiMesh *)0x0;
          while ((paVar18 != (aiMesh *)0x8 && (vUVChannelIndices[(long)paVar18] != 0xffffffff))) {
            local_348 = mesh;
            uVar13 = mesh->mNumVertices;
            uVar17 = (ulong)uVar13 * 0xc;
            local_368 = paVar18;
            paVar21 = (aiVector3D *)operator_new__(uVar17);
            if (uVar13 != 0) {
              uVar17 = uVar17 - 0xc;
              memset(paVar21,0,(uVar17 - uVar17 % 0xc) + 0xc);
            }
            local_348->mTextureCoords[(long)local_368] = paVar21;
            pvUV[(long)local_368] = paVar21;
            mesh->mNumUVComponents[0] = 2;
            paVar18 = (aiMesh *)((long)&local_368->mPrimitiveTypes + 1);
          }
          if (p_Var33[0xb]._M_next == (_List_node_base *)0x0) {
            paVar21 = (aiVector3D *)0x0;
          }
          else {
            local_368 = mesh;
            local_348 = (aiMesh *)(ulong)mesh->mNumVertices;
            uVar17 = (long)local_348 * 0xc;
            paVar21 = (aiVector3D *)operator_new__(uVar17);
            if ((int)local_348 != 0) {
              uVar17 = uVar17 - 0xc;
              memset(paVar21,0,(uVar17 - uVar17 % 0xc) + 0xc);
            }
            local_368->mNormals = paVar21;
          }
          paVar18 = (aiMesh *)0x0;
          while ((this_01 = local_2f8, paVar18 != (aiMesh *)0x8 &&
                 (vVColorIndices[(long)paVar18] != 0xffffffff))) {
            local_348 = mesh;
            local_330 = (aiColor4D *)(ulong)mesh->mNumVertices;
            uVar17 = (long)local_330 << 4;
            local_368 = paVar18;
            paVar22 = (aiColor4D *)operator_new__(uVar17);
            if ((int)local_330 != 0) {
              local_330 = paVar22;
              memset(paVar22,0,uVar17);
              paVar22 = local_330;
            }
            local_348->mColors[(long)local_368] = paVar22;
            pvVC[(long)local_368] = paVar22;
            paVar18 = (aiMesh *)((long)&local_368->mPrimitiveTypes + 1);
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2f8,
                     (const_iterator)p_Var33[2]._M_prev,(const_iterator)p_Var33[3]._M_next);
          local_2fc = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,
                     (ulong)mesh->mNumFaces,&local_2fc);
          p_Var23 = *this_01;
          iVar12 = 0;
          for (puVar24 = (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start; puVar24 != local_2f0;
              puVar24 = puVar24 + 1) {
            puVar1 = (uint *)((long)p_Var33[0x11]._M_next + (ulong)*puVar24 * 0x20);
            *(undefined4 *)&p_Var23->_M_next =
                 *(undefined4 *)((long)p_Var33[0x11]._M_next + ((ulong)*puVar24 * 2 + 1) * 0x10 + 4)
            ;
            for (uVar17 = 0; uVar17 < *puVar1; uVar17 = uVar17 + 1) {
              uVar25 = (ulong)*(uint *)((long)&(*(_List_node_base **)(puVar1 + 2))->_M_next +
                                       uVar17 * 4);
              lVar20 = *(long *)&layer->mTempPoints;
              lVar31 = uVar25 * 0xc;
              __s->z = *(float *)(lVar20 + 8 + lVar31);
              uVar4 = *(undefined8 *)(lVar20 + lVar31);
              __s->x = (float)(int)uVar4;
              __s->y = (float)(int)((ulong)uVar4 >> 0x20);
              for (lVar20 = 0; (lVar20 != 8 && ((ulong)vUVChannelIndices[lVar20] != 0xffffffff));
                  lVar20 = lVar20 + 1) {
                lVar5 = (long)p_Var33[8]._M_prev[(ulong)vUVChannelIndices[lVar20] * 7 + 3]._M_next;
                paVar6 = pvUV[lVar20];
                paVar6->x = *(float *)(lVar5 + uVar25 * 8);
                paVar6->y = *(float *)(lVar5 + 4 + uVar25 * 8);
                pvUV[lVar20] = paVar6 + 1;
              }
              if (paVar21 == (aiVector3D *)0x0) {
                paVar21 = (aiVector3D *)0x0;
              }
              else {
                lVar20 = (long)p_Var33[0xd]._M_next;
                paVar21->z = *(float *)(lVar20 + 8 + lVar31);
                uVar4 = *(undefined8 *)(lVar20 + lVar31);
                paVar21->x = (float)(int)uVar4;
                paVar21->y = (float)(int)((ulong)uVar4 >> 0x20);
                paVar21->z = -paVar21->z;
                paVar21 = paVar21 + 1;
              }
              for (lVar20 = 0; (lVar20 != 8 && ((ulong)vVColorIndices[lVar20] != 0xffffffff));
                  lVar20 = lVar20 + 1) {
                paVar22 = pvVC[lVar20];
                puVar2 = (undefined8 *)
                         (*(long *)((long)p_Var33[7]._M_next + 0x30 +
                                   (ulong)vVColorIndices[lVar20] * 0x70) + uVar25 * 0x10);
                uVar4 = *puVar2;
                uVar7 = puVar2[1];
                paVar22->r = (float)(int)uVar4;
                paVar22->g = (float)(int)((ulong)uVar4 >> 0x20);
                paVar22->b = (float)(int)uVar7;
                paVar22->a = (float)(int)((ulong)uVar7 >> 0x20);
                if (_mSurfaces.
                    super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)paVar32].mVCMapType == 0x52474220
                   ) {
                  paVar22->a = 1.0;
                }
                pvVC[lVar20] = paVar22 + 1;
              }
              *(int *)(*(long *)(puVar1 + 2) + uVar17 * 4) = iVar12;
              iVar12 = iVar12 + 1;
              __s = __s + 1;
            }
            local_350->_M_prev = *(_List_node_base **)(puVar1 + 2);
            *(uint *)&local_350->_M_next = *puVar1;
            puVar1[2] = 0;
            puVar1[3] = 0;
            local_350 = local_350 + 1;
            p_Var23 = (_List_node_base *)((long)&p_Var23->_M_next + 4);
          }
          if (mesh->mNormals == (aiVector3D *)0x0) {
            ComputeNormals(local_370,mesh,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2f8,
                           _mSurfaces.
                           super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                           ._M_impl.super__Vector_impl_data._M_start + (long)paVar32);
            uVar13 = local_358;
          }
          else {
            pLVar16 = DefaultLogger::get();
            uVar13 = local_358;
            Logger::debug(pLVar16,"LWO2: No need to compute normals, they\'re already there");
          }
        }
        paVar32 = (aiMesh *)(ulong)(uVar13 + 1);
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&pSorted);
      lVar20 = (long)apcMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)apcMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    }
    uVar17 = lVar20 - lVar29;
    local_350 = (_List_node_base *)&p_Var33[0x13]._M_prev;
    bVar11 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_350,"<LWODefault>");
    uVar13 = (uint)uVar17;
    if ((bVar11) || (uVar13 != 0)) {
      this_02 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_02);
      uVar25 = (ulong)p_Var33[0x14]._M_next;
      if (uVar25 < 0x400) {
        (this_02->mName).length = (ai_uint32)uVar25;
        memcpy((this_02->mName).data,local_350->_M_next,uVar25);
        (this_02->mName).data[uVar25] = '\0';
      }
      this_02->mParent = (aiNode *)layer;
      this_02->mNumMeshes = uVar13;
      if (uVar13 != 0) {
        puVar24 = (uint *)operator_new__((uVar17 & 0xffffffff) << 2);
        this_02->mMeshes = puVar24;
        for (uVar25 = 0; uVar25 < (uVar17 & 0xffffffff); uVar25 = uVar25 + 1) {
          this_02->mMeshes[uVar25] = (int)lVar29 + (int)uVar25;
          uVar17 = (ulong)this_02->mNumMeshes;
        }
      }
      ppaVar26 = std::
                 map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                 ::operator[](&apcNodes,(key_type_conflict2 *)((long)&p_Var33[0x13]._M_next + 2));
      *ppaVar26 = this_02;
    }
  } while( true );
}

Assistant:

void LWOImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene,
    IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open LWO file " + pFile + ".");

    if((this->fileSize = (unsigned int)file->FileSize()) < 12)
        throw DeadlyImportError("LWO: The file is too small to contain the IFF header");

    // Allocate storage and copy the contents of the file to a memory buffer
    std::vector< uint8_t > mBuffer(fileSize);
    file->Read( &mBuffer[0], 1, fileSize);
    this->pScene = pScene;

    // Determine the type of the file
    uint32_t fileType;
    const char* sz = IFF::ReadHeader(&mBuffer[0],fileType);
    if (sz)throw DeadlyImportError(sz);

    mFileBuffer = &mBuffer[0] + 12;
    fileSize -= 12;

    // Initialize some members with their default values
    hasNamedLayer   = false;

    // Create temporary storage on the stack but store pointers to it in the class
    // instance. Therefore everything will be destructed properly if an exception
    // is thrown and we needn't take care of that.
    LayerList       _mLayers;
    SurfaceList     _mSurfaces;
    TagList         _mTags;
    TagMappingTable _mMapping;

    mLayers         = &_mLayers;
    mTags           = &_mTags;
    mMapping        = &_mMapping;
    mSurfaces       = &_mSurfaces;

    // Allocate a default layer (layer indices are 1-based from now)
    mLayers->push_back(Layer());
    mCurLayer = &mLayers->back();
    mCurLayer->mName = "<LWODefault>";
    mCurLayer->mIndex = -1;

    // old lightwave file format (prior to v6)
    if (AI_LWO_FOURCC_LWOB == fileType) {
        ASSIMP_LOG_INFO("LWO file format: LWOB (<= LightWave 5.5)");

        mIsLWO2 = false;
        mIsLXOB = false;
        LoadLWOBFile();
    }
    // New lightwave format
    else if (AI_LWO_FOURCC_LWO2 == fileType)    {
        mIsLXOB = false;
        ASSIMP_LOG_INFO("LWO file format: LWO2 (>= LightWave 6)");
    }
    // MODO file format
    else if (AI_LWO_FOURCC_LXOB == fileType)    {
        mIsLXOB = true;
        ASSIMP_LOG_INFO("LWO file format: LXOB (Modo)");
    }
    // we don't know this format
    else
    {
        char szBuff[5];
        szBuff[0] = (char)(fileType >> 24u);
        szBuff[1] = (char)(fileType >> 16u);
        szBuff[2] = (char)(fileType >> 8u);
        szBuff[3] = (char)(fileType);
        szBuff[4] = '\0';
        throw DeadlyImportError(std::string("Unknown LWO sub format: ") + szBuff);
    }

    if (AI_LWO_FOURCC_LWOB != fileType) {
        mIsLWO2 = true;
        LoadLWO2File();

        // The newer lightwave format allows the user to configure the
        // loader that just one layer is used. If this is the case
        // we need to check now whether the requested layer has been found.
        if (UINT_MAX != configLayerIndex) {
            unsigned int layerCount = 0;
            for(std::list<LWO::Layer>::iterator itLayers=mLayers->begin(); itLayers!=mLayers->end(); ++itLayers)
                if (!itLayers->skip)
                    layerCount++;
            if (layerCount!=2)
                throw DeadlyImportError("LWO2: The requested layer was not found");
        }

        if (configLayerName.length() && !hasNamedLayer) {
            throw DeadlyImportError("LWO2: Unable to find the requested layer: "
                + configLayerName);
        }
    }

    // now, as we have loaded all data, we can resolve cross-referenced tags and clips
    ResolveTags();
    ResolveClips();

    // now process all layers and build meshes and nodes
    std::vector<aiMesh*> apcMeshes;
    std::map<uint16_t, aiNode*> apcNodes;

    apcMeshes.reserve(mLayers->size()*std::min(((unsigned int)mSurfaces->size()/2u), 1u));

    unsigned int iDefaultSurface = UINT_MAX; // index of the default surface
	for (LWO::Layer &layer : *mLayers) {
        if (layer.skip)
            continue;

        // I don't know whether there could be dummy layers, but it would be possible
        const unsigned int meshStart = (unsigned int)apcMeshes.size();
        if (!layer.mFaces.empty() && !layer.mTempPoints.empty())    {

            // now sort all faces by the surfaces assigned to them
            std::vector<SortedRep> pSorted(mSurfaces->size()+1);

            unsigned int i = 0;
            for (FaceList::iterator it = layer.mFaces.begin(), end = layer.mFaces.end();it != end;++it,++i) {
                // Check whether we support this face's type
                if ((*it).type != AI_LWO_FACE && (*it).type != AI_LWO_PTCH &&
                    (*it).type != AI_LWO_BONE && (*it).type != AI_LWO_SUBD) {
                    continue;
                }

                unsigned int idx = (*it).surfaceIndex;
                if (idx >= mTags->size())
                {
                    ASSIMP_LOG_WARN("LWO: Invalid face surface index");
                    idx = UINT_MAX;
                }
                if(UINT_MAX == idx || UINT_MAX == (idx = _mMapping[idx]))   {
                    if (UINT_MAX == iDefaultSurface)    {
                        iDefaultSurface = (unsigned int)mSurfaces->size();
                        mSurfaces->push_back(LWO::Surface());
                        LWO::Surface& surf = mSurfaces->back();
                        surf.mColor.r = surf.mColor.g = surf.mColor.b = 0.6f;
                        surf.mName = "LWODefaultSurface";
                    }
                    idx = iDefaultSurface;
                }
                pSorted[idx].push_back(i);
            }
            if (UINT_MAX == iDefaultSurface) {
                pSorted.erase(pSorted.end()-1);
            }
            for (unsigned int p = 0,i = 0;i < mSurfaces->size();++i)    {
                SortedRep& sorted = pSorted[i];
                if (sorted.empty())
                    continue;

                // generate the mesh
                aiMesh* mesh = new aiMesh();
                apcMeshes.push_back(mesh);
                mesh->mNumFaces = (unsigned int)sorted.size();

                // count the number of vertices
                SortedRep::const_iterator it = sorted.begin(), end = sorted.end();
                for (;it != end;++it)   {
                    mesh->mNumVertices += layer.mFaces[*it].mNumIndices;
                }

                aiVector3D *nrm = NULL, * pv = mesh->mVertices = new aiVector3D[mesh->mNumVertices];
                aiFace* pf = mesh->mFaces = new aiFace[mesh->mNumFaces];
                mesh->mMaterialIndex = i;

                // find out which vertex color channels and which texture coordinate
                // channels are really required by the material attached to this mesh
                unsigned int vUVChannelIndices[AI_MAX_NUMBER_OF_TEXTURECOORDS];
                unsigned int vVColorIndices[AI_MAX_NUMBER_OF_COLOR_SETS];

#ifdef ASSIMP_BUILD_DEBUG
                for (unsigned int mui = 0; mui < AI_MAX_NUMBER_OF_TEXTURECOORDS;++mui ) {
                    vUVChannelIndices[mui] = UINT_MAX;
                }
                for (unsigned int mui = 0; mui < AI_MAX_NUMBER_OF_COLOR_SETS;++mui ) {
                    vVColorIndices[mui] = UINT_MAX;
                }
#endif

                FindUVChannels(_mSurfaces[i],sorted,layer,vUVChannelIndices);
                FindVCChannels(_mSurfaces[i],sorted,layer,vVColorIndices);

                // allocate storage for UV and CV channels
                aiVector3D* pvUV[AI_MAX_NUMBER_OF_TEXTURECOORDS];
                for (unsigned int mui = 0; mui < AI_MAX_NUMBER_OF_TEXTURECOORDS;++mui ) {
                    if (UINT_MAX == vUVChannelIndices[mui]) {
                        break;
                    }

                    pvUV[mui] = mesh->mTextureCoords[mui] = new aiVector3D[mesh->mNumVertices];

                    // LightWave doesn't support more than 2 UV components (?)
                    mesh->mNumUVComponents[0] = 2;
                }

                if (layer.mNormals.name.length())
                    nrm = mesh->mNormals = new aiVector3D[mesh->mNumVertices];

                aiColor4D* pvVC[AI_MAX_NUMBER_OF_COLOR_SETS];
                for (unsigned int mui = 0; mui < AI_MAX_NUMBER_OF_COLOR_SETS;++mui) {
                    if (UINT_MAX == vVColorIndices[mui]) {
                        break;
                    }
                    pvVC[mui] = mesh->mColors[mui] = new aiColor4D[mesh->mNumVertices];
                }

                // we would not need this extra array, but the code is much cleaner if we use it
                std::vector<unsigned int>& smoothingGroups = layer.mPointReferrers;
                smoothingGroups.erase (smoothingGroups.begin(),smoothingGroups.end());
                smoothingGroups.resize(mesh->mNumFaces,0);

                // now convert all faces
                unsigned int vert = 0;
                std::vector<unsigned int>::iterator outIt = smoothingGroups.begin();
                for (it = sorted.begin(); it != end;++it,++outIt)   {
                    const LWO::Face& face = layer.mFaces[*it];
                    *outIt = face.smoothGroup;

                    // copy all vertices
                    for (unsigned int q = 0; q  < face.mNumIndices;++q,++vert)  {
                        unsigned int idx = face.mIndices[q];
                        *pv++ = layer.mTempPoints[idx] /*- layer.mPivot*/;

                        // process UV coordinates
                        for (unsigned int w = 0; w < AI_MAX_NUMBER_OF_TEXTURECOORDS;++w)    {
                            if (UINT_MAX == vUVChannelIndices[w]) {
                                break;
                            }
                            aiVector3D*& pp = pvUV[w];
                            const aiVector2D& src = ((aiVector2D*)&layer.mUVChannels[vUVChannelIndices[w]].rawData[0])[idx];
                            pp->x = src.x;
                            pp->y = src.y;
                            pp++;
                        }

                        // process normals (MODO extension)
                        if (nrm)    {
                            *nrm = ((aiVector3D*)&layer.mNormals.rawData[0])[idx];
                            nrm->z *= -1.f;
                            ++nrm;
                        }

                        // process vertex colors
                        for (unsigned int w = 0; w < AI_MAX_NUMBER_OF_COLOR_SETS;++w)   {
                            if (UINT_MAX == vVColorIndices[w]) {
                                break;
                            }
                            *pvVC[w] = ((aiColor4D*)&layer.mVColorChannels[vVColorIndices[w]].rawData[0])[idx];

                            // If a RGB color map is explicitly requested delete the
                            // alpha channel - it could theoretically be != 1.
                            if(_mSurfaces[i].mVCMapType == AI_LWO_RGB)
                                pvVC[w]->a = 1.f;

                            pvVC[w]++;
                        }

#if 0
                        // process vertex weights. We can't properly reconstruct the whole skeleton for now,
                        // but we can create dummy bones for all weight channels which we have.
                        for (unsigned int w = 0; w < layer.mWeightChannels.size();++w)
                        {
                        }
#endif

                        face.mIndices[q] = vert;
                    }
                    pf->mIndices = face.mIndices;
                    pf->mNumIndices = face.mNumIndices;
                    unsigned int** p = (unsigned int**)&face.mIndices;*p = NULL; // HACK: make sure it won't be deleted
                    pf++;
                }

                if (!mesh->mNormals)    {
                    // Compute normal vectors for the mesh - we can't use our GenSmoothNormal-
                    // Step here since it wouldn't handle smoothing groups correctly for LWO.
                    // So we use a separate implementation.
                    ComputeNormals(mesh,smoothingGroups,_mSurfaces[i]);
                }
                else {
                    ASSIMP_LOG_DEBUG("LWO2: No need to compute normals, they're already there");
                }
                ++p;
            }
        }

        // Generate nodes to render the mesh. Store the source layer in the mParent member of the nodes
        unsigned int num = static_cast<unsigned int>(apcMeshes.size() - meshStart);
        if (layer.mName != "<LWODefault>" || num > 0) {
            aiNode* pcNode = new aiNode();
            pcNode->mName.Set(layer.mName);
            pcNode->mParent = (aiNode*)&layer;
            pcNode->mNumMeshes = num;

            if (pcNode->mNumMeshes) {
                pcNode->mMeshes = new unsigned int[pcNode->mNumMeshes];
                for (unsigned int p = 0; p < pcNode->mNumMeshes;++p)
                    pcNode->mMeshes[p] = p + meshStart;
            }
            apcNodes[layer.mIndex] = pcNode;
        }
    }

    if (apcNodes.empty() || apcMeshes.empty())
        throw DeadlyImportError("LWO: No meshes loaded");

    // The RemoveRedundantMaterials step will clean this up later
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials = (unsigned int)mSurfaces->size()];
    for (unsigned int mat = 0; mat < pScene->mNumMaterials;++mat)   {
        aiMaterial* pcMat = new aiMaterial();
        pScene->mMaterials[mat] = pcMat;
        ConvertMaterial((*mSurfaces)[mat],pcMat);
    }

    // copy the meshes to the output structure
    pScene->mMeshes = new aiMesh*[ pScene->mNumMeshes = (unsigned int)apcMeshes.size() ];
    ::memcpy(pScene->mMeshes,&apcMeshes[0],pScene->mNumMeshes*sizeof(void*));

    // generate the final node graph
    GenerateNodeGraph(apcNodes);
}